

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

bool __thiscall SessionManager::haveROSession(SessionManager *this,CK_SLOT_ID slotID)

{
  pointer ppSVar1;
  bool bVar2;
  Slot *this_00;
  CK_SLOT_ID CVar3;
  pointer ppSVar4;
  MutexLocker lock;
  MutexLocker local_30;
  
  MutexLocker::MutexLocker(&local_30,this->sessionsMutex);
  for (ppSVar4 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppSVar4 != ppSVar1; ppSVar4 = ppSVar4 + 1) {
    if (*ppSVar4 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar4);
      CVar3 = Slot::getSlotID(this_00);
      if (CVar3 == slotID) {
        bVar2 = Session::isRW(*ppSVar4);
        if (!bVar2) break;
      }
    }
  }
  MutexLocker::~MutexLocker(&local_30);
  return ppSVar4 != ppSVar1;
}

Assistant:

bool SessionManager::haveROSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() != slotID) continue;

		if ((*i)->isRW() == false) return true;
	}

	return false;
}